

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::UnescapeCEscapeSequences
              (char *source,char *dest,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *errors)

{
  uint uVar1;
  int iVar2;
  LogMessage *pLVar3;
  char *pcVar4;
  bool bVar5;
  char *hex_start;
  uint ch_1;
  char ch;
  char *p;
  char *d;
  byte local_61;
  LogMessage local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *errors_local;
  char *dest_local;
  char *source_local;
  
  local_61 = 0;
  local_28 = errors;
  errors_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)dest;
  dest_local = source;
  if (errors != (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/strutil.cc"
               ,0x131);
    local_61 = 1;
    pLVar3 = internal::LogMessage::operator<<(&local_60,"CHECK failed: errors == NULL: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,"Error reporting not implemented.");
    internal::LogFinisher::operator=((LogFinisher *)((long)&d + 3),pLVar3);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  p = (char *)errors_local;
  _ch_1 = dest_local;
  while( true ) {
    bVar5 = false;
    if ((_ch_1 == p) && (bVar5 = false, *_ch_1 != '\0')) {
      bVar5 = *_ch_1 != '\\';
    }
    if (!bVar5) break;
    _ch_1 = _ch_1 + 1;
    p = p + 1;
  }
  while( true ) {
    if (*_ch_1 == '\0') break;
    if (*_ch_1 == '\\') {
      pcVar4 = _ch_1 + 1;
      switch(_ch_1[1]) {
      case '\0':
        *p = '\0';
        goto LAB_00360d8a;
      default:
        break;
      case '\"':
        *p = '\"';
        p = p + 1;
        break;
      case '\'':
        *p = '\'';
        p = p + 1;
        break;
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
        hex_start._7_1_ = *pcVar4 + -0x30;
        if (('/' < _ch_1[2]) && (_ch_1[2] < '8')) {
          hex_start._7_1_ = hex_start._7_1_ * '\b' + _ch_1[2] + -0x30;
          pcVar4 = _ch_1 + 2;
        }
        _ch_1 = pcVar4;
        if (('/' < _ch_1[1]) && (_ch_1[1] < '8')) {
          hex_start._7_1_ = hex_start._7_1_ * '\b' + _ch_1[1] + -0x30;
          _ch_1 = _ch_1 + 1;
        }
        *p = hex_start._7_1_;
        p = p + 1;
        pcVar4 = _ch_1;
        break;
      case '?':
        *p = '?';
        p = p + 1;
        break;
      case 'X':
      case 'x':
        uVar1 = isxdigit((int)_ch_1[2]);
        if ((uVar1 & 1) != 0) {
          hex_start._0_4_ = 0;
          _ch_1 = pcVar4;
          while (uVar1 = isxdigit((int)_ch_1[1]), (uVar1 & 1) != 0) {
            iVar2 = hex_digit_to_int(_ch_1[1]);
            hex_start._0_4_ = (int)hex_start * 0x10 + iVar2;
            _ch_1 = _ch_1 + 1;
          }
          *p = (char)(int)hex_start;
          p = p + 1;
          pcVar4 = _ch_1;
        }
        break;
      case '\\':
        *p = '\\';
        p = p + 1;
        break;
      case 'a':
        *p = '\a';
        p = p + 1;
        break;
      case 'b':
        *p = '\b';
        p = p + 1;
        break;
      case 'f':
        *p = '\f';
        p = p + 1;
        break;
      case 'n':
        *p = '\n';
        p = p + 1;
        break;
      case 'r':
        *p = '\r';
        p = p + 1;
        break;
      case 't':
        *p = '\t';
        p = p + 1;
        break;
      case 'v':
        *p = '\v';
        p = p + 1;
      }
    }
    else {
      *p = *_ch_1;
      p = p + 1;
      pcVar4 = _ch_1;
    }
    _ch_1 = pcVar4 + 1;
  }
  *p = '\0';
LAB_00360d8a:
  source_local._4_4_ = (int)p - (int)errors_local;
  return source_local._4_4_;
}

Assistant:

int UnescapeCEscapeSequences(const char* source, char* dest,
                             vector<string> *errors) {
  GOOGLE_DCHECK(errors == NULL) << "Error reporting not implemented.";

  char* d = dest;
  const char* p = source;

  // Small optimization for case where source = dest and there's no escaping
  while ( p == d && *p != '\0' && *p != '\\' )
    p++, d++;

  while (*p != '\0') {
    if (*p != '\\') {
      *d++ = *p++;
    } else {
      switch ( *++p ) {                    // skip past the '\\'
        case '\0':
          LOG_STRING(ERROR, errors) << "String cannot end with \\";
          *d = '\0';
          return d - dest;   // we're done with p
        case 'a':  *d++ = '\a';  break;
        case 'b':  *d++ = '\b';  break;
        case 'f':  *d++ = '\f';  break;
        case 'n':  *d++ = '\n';  break;
        case 'r':  *d++ = '\r';  break;
        case 't':  *d++ = '\t';  break;
        case 'v':  *d++ = '\v';  break;
        case '\\': *d++ = '\\';  break;
        case '?':  *d++ = '\?';  break;    // \?  Who knew?
        case '\'': *d++ = '\'';  break;
        case '"':  *d++ = '\"';  break;
        case '0': case '1': case '2': case '3':  // octal digit: 1 to 3 digits
        case '4': case '5': case '6': case '7': {
          char ch = *p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )
            ch = ch * 8 + *++p - '0';
          if ( IS_OCTAL_DIGIT(p[1]) )      // safe (and easy) to do this twice
            ch = ch * 8 + *++p - '0';      // now points at last digit
          *d++ = ch;
          break;
        }
        case 'x': case 'X': {
          if (!isxdigit(p[1])) {
            if (p[1] == '\0') {
              LOG_STRING(ERROR, errors) << "String cannot end with \\x";
            } else {
              LOG_STRING(ERROR, errors) <<
                "\\x cannot be followed by non-hex digit: \\" << *p << p[1];
            }
            break;
          }
          unsigned int ch = 0;
          const char *hex_start = p;
          while (isxdigit(p[1]))  // arbitrarily many hex digits
            ch = (ch << 4) + hex_digit_to_int(*++p);
          if (ch > 0xFF)
            LOG_STRING(ERROR, errors) << "Value of " <<
              "\\" << string(hex_start, p+1-hex_start) << " exceeds 8 bits";
          *d++ = ch;
          break;
        }
#if 0  // TODO(kenton):  Support \u and \U?  Requires runetochar().
        case 'u': {
          // \uhhhh => convert 4 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 4; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              rune = (rune << 4) + hex_digit_to_int(*++p);  // Advance p.
            } else {
              LOG_STRING(ERROR, errors)
                << "\\u must be followed by 4 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
        case 'U': {
          // \Uhhhhhhhh => convert 8 hex digits to UTF-8
          char32 rune = 0;
          const char *hex_start = p;
          for (int i = 0; i < 8; ++i) {
            if (isxdigit(p[1])) {  // Look one char ahead.
              // Don't change rune until we're sure this
              // is within the Unicode limit, but do advance p.
              char32 newrune = (rune << 4) + hex_digit_to_int(*++p);
              if (newrune > 0x10FFFF) {
                LOG_STRING(ERROR, errors)
                  << "Value of \\"
                  << string(hex_start, p + 1 - hex_start)
                  << " exceeds Unicode limit (0x10FFFF)";
                break;
              } else {
                rune = newrune;
              }
            } else {
              LOG_STRING(ERROR, errors)
                << "\\U must be followed by 8 hex digits: \\"
                <<  string(hex_start, p+1-hex_start);
              break;
            }
          }
          d += runetochar(d, &rune);
          break;
        }
#endif
        default:
          LOG_STRING(ERROR, errors) << "Unknown escape sequence: \\" << *p;
      }
      p++;                                 // read past letter we escaped
    }
  }
  *d = '\0';
  return d - dest;
}